

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  uint uVar1;
  ZSTD_DDictHashSet *pZVar2;
  ZSTD_DDict *pZVar3;
  ulong uVar4;
  uint uVar5;
  unsigned_long_long uVar6;
  ulong uVar7;
  ulong uVar8;
  uint local_2c;
  
  if (dctx->ddict != (ZSTD_DDict *)0x0) {
    pZVar2 = dctx->ddictSet;
    uVar1 = (dctx->fParams).dictID;
    local_2c = uVar1;
    uVar6 = XXH64(&local_2c,4,0);
    uVar8 = pZVar2->ddictPtrTableSize - 1;
    uVar4 = uVar6 & uVar8;
    do {
      uVar7 = uVar4;
      uVar5 = ZSTD_getDictID_fromDDict(pZVar2->ddictPtrTable[uVar7]);
      if (uVar5 == uVar1) break;
      uVar4 = (uVar7 & uVar8) + 1;
    } while (uVar5 != 0);
    pZVar3 = pZVar2->ddictPtrTable[uVar7];
    if (pZVar3 != (ZSTD_DDict *)0x0) {
      ZSTD_freeDDict(dctx->ddictLocal);
      dctx->ddictLocal = (ZSTD_DDict *)0x0;
      dctx->dictID = (dctx->fParams).dictID;
      dctx->ddict = pZVar3;
      dctx->dictUses = ZSTD_use_indefinitely;
    }
  }
  return;
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}